

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall
cfd::TransactionContext::SplitTxOut
          (TransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *locking_script_list)

{
  pointer pAVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  CfdException *pCVar5;
  undefined1 extraout_DL;
  long lVar6;
  ulong uVar7;
  Amount *amount;
  pointer pAVar8;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range1;
  allocator local_e5;
  uint32_t local_e4;
  string local_e0;
  ByteData prev_tx;
  Amount total_amount;
  TxOutReference ref;
  
  local_e4 = index;
  if (SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
      ::kMinimumAmount == '\0') {
    iVar3 = __cxa_guard_acquire(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                                 ::kMinimumAmount);
    if (iVar3 != 0) {
      cfd::core::Amount::Amount
                ((Amount *)
                 SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                 ::kMinimumAmount,100);
      __cxa_guard_release(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                           ::kMinimumAmount);
    }
  }
  pAVar8 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)(locking_script_list->
                super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(locking_script_list->
                super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar4 % 0x38;
  if ((long)pAVar1 - (long)pAVar8 >> 4 != lVar4 / 0x38) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30,pAVar1,lVar6);
    std::__cxx11::string::string((string *)&ref,"Unmatch list count.",(allocator *)&local_e0);
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&ref);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (pAVar8 == pAVar1) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30,pAVar1,lVar6);
    std::__cxx11::string::string((string *)&ref,"list is empty.",(allocator *)&local_e0);
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&ref);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::Transaction::GetTxOut((uint)&ref);
  _total_amount =
       SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
       ::kMinimumAmount._0_8_;
  pAVar1 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pAVar8 = (amount_list->
                super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
                super__Vector_impl_data._M_start; pAVar8 != pAVar1; pAVar8 = pAVar8 + 0x10) {
    cfd::core::Amount::operator+=(&total_amount,pAVar8);
  }
  cVar2 = cfd::core::operator<((Amount *)&local_e0,&total_amount);
  if (cVar2 == '\0') {
    prev_tx.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)cfd::core::operator-
                            (&total_amount,
                             (Amount *)
                             SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                             ::kMinimumAmount);
    prev_tx.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = extraout_DL;
    cfd::core::operator-((Amount *)&local_e0,(Amount *)&prev_tx);
    (**(code **)(*(long *)this + 0x40))(&prev_tx,this);
    cfd::core::Transaction::SetTxOutValue((uint)this,(Amount *)(ulong)local_e4);
    lVar4 = 0;
    uVar7 = 0;
    while( true ) {
      if ((ulong)((long)(amount_list->
                        super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(amount_list->
                        super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 4) <= uVar7) {
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prev_tx);
        core::AbstractTxOutReference::~AbstractTxOutReference((AbstractTxOutReference *)&ref);
        return;
      }
      cVar2 = cfd::core::Script::IsEmpty();
      if (cVar2 != '\0') break;
      cfd::core::Transaction::AddTxOut
                ((Amount *)this,
                 (Script *)
                 ((amount_list->
                  super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl
                  .super__Vector_impl_data._M_start + lVar4));
      uVar7 = uVar7 + 1;
      lVar4 = lVar4 + 0x10;
    }
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_e0,"Locking script is empty.",&local_e5);
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_e0);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_e0,"The Amount is too large.",(allocator *)&prev_tx)
  ;
  core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_e0);
  __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Script>& locking_script_list) {
  static const Amount kMinimumAmount(int64_t{100});

  if (amount_list.size() != locking_script_list.size()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch list count.");
  } else if (amount_list.empty()) {
    throw CfdException(CfdError::kCfdIllegalArgumentError, "list is empty.");
  }

  auto ref = GetTxOut(index);
  Amount total_amount = kMinimumAmount;
  for (const auto& amount : amount_list) total_amount += amount;

  if (ref.GetValue() < total_amount) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "The Amount is too large.");
  }
  Amount update_amount = ref.GetValue() - (total_amount - kMinimumAmount);

  ByteData prev_tx = GetData();
  try {
    SetTxOutValue(index, update_amount);
    for (size_t txout_idx = 0; txout_idx < amount_list.size(); ++txout_idx) {
      if (locking_script_list[txout_idx].IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Locking script is empty.");
      }
      AddTxOut(amount_list[txout_idx], locking_script_list[txout_idx]);
    }
  } catch (const CfdException& except) {
    SetFromHex(prev_tx.GetHex());  // rollback
    throw except;
  }
}